

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar xmlPopInput(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr *ppxVar1;
  xmlParserInputPtr input;
  xmlChar xVar2;
  long lVar3;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    lVar3 = (long)ctxt->inputNr;
    if (lVar3 < 2) {
      xVar2 = '\0';
    }
    else {
      ctxt->inputNr = ctxt->inputNr + -1;
      ppxVar1 = ctxt->inputTab;
      ctxt->input = ppxVar1[lVar3 + -2];
      input = ppxVar1[lVar3 + -1];
      ppxVar1[lVar3 + -1] = (xmlParserInputPtr)0x0;
      xmlFreeInputStream(input);
      if (*ctxt->input->cur == '\0') {
        xmlParserGrow(ctxt);
      }
      xVar2 = *ctxt->input->cur;
    }
    return xVar2;
  }
  return '\0';
}

Assistant:

xmlChar
xmlPopInput(xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr input;

    if ((ctxt == NULL) || (ctxt->inputNr <= 1)) return(0);
    input = xmlCtxtPopInput(ctxt);
    xmlFreeInputStream(input);
    if (*ctxt->input->cur == 0)
        xmlParserGrow(ctxt);
    return(CUR);
}